

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O2

void __thiscall
gmlc::containers::
BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
::emplacePriority<helics::route_id&,helics::ActionMessage>
          (BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
           *this,route_id *args,ActionMessage *args_1)

{
  bool bVar1;
  bool expEmpty;
  unique_lock<std::mutex> pullLock;
  
  expEmpty = true;
  bVar1 = std::atomic<bool>::compare_exchange_strong
                    ((atomic<bool> *)(this + 0x80),&expEmpty,false,seq_cst);
  if (bVar1) {
    std::unique_lock<std::mutex>::unique_lock(&pullLock,(mutex_type *)(this + 0x28));
    LOCK();
    this[0x80] = (BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
                  )0x0;
    UNLOCK();
    std::
    deque<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
    ::emplace_back<helics::route_id&,helics::ActionMessage>
              ((deque<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
                *)(this + 0x88),args,args_1);
  }
  else {
    std::unique_lock<std::mutex>::unique_lock(&pullLock,(mutex_type *)(this + 0x28));
    std::
    deque<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
    ::emplace_back<helics::route_id&,helics::ActionMessage>
              ((deque<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
                *)(this + 0x88),args,args_1);
    expEmpty = true;
    bVar1 = std::atomic<bool>::compare_exchange_strong
                      ((atomic<bool> *)(this + 0x80),&expEmpty,false,seq_cst);
    if (!bVar1) goto LAB_0026e9f3;
  }
  std::condition_variable::notify_all();
LAB_0026e9f3:
  std::unique_lock<std::mutex>::~unique_lock(&pullLock);
  return;
}

Assistant:

void emplacePriority(Args&&... args)
        {
            bool expEmpty = true;
            if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                std::unique_lock<MUTEX> pullLock(m_pullLock);  // first pullLock
                queueEmptyFlag = false;  // need to set the flag again just in
                                         // case after we get the lock
                priorityQueue.emplace(std::forward<Args>(args)...);
                // pullLock.unlock ();
                condition.notify_all();
            } else {
                std::unique_lock<MUTEX> pullLock(m_pullLock);
                priorityQueue.emplace(std::forward<Args>(args)...);
                expEmpty = true;
                if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                    condition.notify_all();
                }
            }
        }